

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void compact_float32_suite::fail_array16_float32_invalid_length(void)

{
  value_type input [7];
  decoder decoder;
  undefined4 local_40;
  value local_3c;
  uchar local_38 [8];
  decoder local_30;
  
  local_30.input._M_str = local_38;
  local_38[4] = '\0';
  local_38[5] = 0x80;
  local_38[6] = '?';
  local_38[0] = 0xbd;
  local_38[1] = '\x03';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_30.input._M_len = 7;
  local_30.current.view._M_len = 0;
  local_30.current.view._M_str = (uchar *)0x0;
  local_30.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_30);
  local_3c = local_30.current.code;
  local_40 = 3;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::error_invalid_length",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xda3,"void compact_float32_suite::fail_array16_float32_invalid_length()",&local_3c,
             &local_40);
  return;
}

Assistant:

void fail_array16_float32_invalid_length()
{
    const value_type input[] = { token::code::array16_float32, 0x03, 0x00, 0x00, 0x00, 0x80, 0x3F };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::error_invalid_length);
}